

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Cues::Init(Cues *this)

{
  bool bVar1;
  longlong lVar2;
  IMkvReader *pReader_00;
  longlong lVar3;
  long *len_00;
  long pos_00;
  undefined8 *in_RDI;
  longlong size;
  longlong id;
  long len;
  longlong idpos;
  long cue_points_size;
  longlong pos;
  longlong stop;
  IMkvReader *pReader;
  long local_40;
  longlong pos_01;
  long *plVar4;
  long lVar5;
  IMkvReader *pReader_01;
  bool local_1;
  
  if (in_RDI[5] == 0) {
    if ((in_RDI[6] == 0) && (in_RDI[7] == 0)) {
      pReader_01 = *(IMkvReader **)*in_RDI;
      pos_00 = in_RDI[1] + in_RDI[2];
      pos_01 = 0;
      len_00 = (long *)in_RDI[1];
      while ((long)len_00 < pos_00) {
        plVar4 = len_00;
        lVar2 = ReadID(pReader_01,pos_00,len_00);
        if ((lVar2 < 0) || (pos_00 < (long)plVar4 + local_40)) {
          return false;
        }
        pReader_00 = (IMkvReader *)(local_40 + (long)plVar4);
        lVar3 = ReadUInt(pReader_00,pos_01,len_00);
        if ((lVar3 < 0) || (pos_00 < (long)&pReader_00->_vptr_IMkvReader + local_40)) {
          return false;
        }
        lVar5 = (long)&pReader_00->_vptr_IMkvReader + local_40;
        if (pos_00 < lVar5 + lVar3) {
          return false;
        }
        if ((lVar2 == 0xbb) &&
           (bVar1 = PreloadCuePoint((Cues *)cue_points_size,(long *)idpos,len), !bVar1)) {
          return false;
        }
        len_00 = (long *)(lVar3 + lVar5);
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Cues::Init() const {
  if (m_cue_points)
    return true;

  if (m_count != 0 || m_preload_count != 0)
    return false;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  const long long stop = m_start + m_size;
  long long pos = m_start;

  long cue_points_size = 0;

  while (pos < stop) {
    const long long idpos = pos;

    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if (size < 0 || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if (pos + size > stop) {
      return false;
    }

    if (id == libwebm::kMkvCuePoint) {
      if (!PreloadCuePoint(cue_points_size, idpos))
        return false;
    }

    pos += size;  // skip payload
  }
  return true;
}